

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O0

void rev_ifk(kcc_joint *joint,mc_wrench *f,joint_torque *tau,int count)

{
  joint_axis jVar1;
  int local_2c;
  int i;
  int k;
  int count_local;
  joint_torque *tau_local;
  mc_wrench *f_local;
  kcc_joint *joint_local;
  
  if (joint == (kcc_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x134,
                  "void rev_ifk(const struct kcc_joint *, const struct mc_wrench *, joint_torque *, int)"
                 );
  }
  if (f != (mc_wrench *)0x0) {
    if (tau != (joint_torque *)0x0) {
      jVar1 = (joint->field_1).revolute_joint.axis;
      for (local_2c = 0; local_2c < count; local_2c = local_2c + 1) {
        tau[local_2c] = f->torque[local_2c].field_0.data[(int)jVar1];
      }
      return;
    }
    __assert_fail("tau",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x136,
                  "void rev_ifk(const struct kcc_joint *, const struct mc_wrench *, joint_torque *, int)"
                 );
  }
  __assert_fail("f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,0x135,
                "void rev_ifk(const struct kcc_joint *, const struct mc_wrench *, joint_torque *, int)"
               );
}

Assistant:

static void rev_ifk(
        const struct kcc_joint *joint,
        const struct mc_wrench *f,
        joint_torque *tau,
        int count)
{
    assert(joint);
    assert(f);
    assert(tau);

    int k = joint->revolute_joint.axis;

    for (int i = 0; i < count; i++) {
        tau[i] = f->torque[i].data[k];
    }
}